

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

void __thiscall
HashMap<String,_(anonymous_namespace)::AddrInfo>::~HashMap
          (HashMap<String,_(anonymous_namespace)::AddrInfo> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *pIVar2;
  String *pSVar3;
  
  if (this->data != (Item **)0x0) {
    operator_delete__(this->data);
  }
  for (pSVar3 = (String *)&this->_begin; pSVar3 = (String *)pSVar3->data,
      (Item *)pSVar3 != &this->endItem; pSVar3 = pSVar3 + 2) {
    String::~String(pSVar3);
  }
  pIVar2 = this->blocks;
  while (pIVar2 != (ItemBlock *)0x0) {
    pIVar1 = pIVar2->next;
    operator_delete__(pIVar2);
    pIVar2 = pIVar1;
  }
  String::~String(&(this->endItem).key);
  return;
}

Assistant:

~HashMap()
  {
    delete[] (char*)data;
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }